

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::NegateIntegerConstant
                   (ConstantManager *const_mgr,Constant *c)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar3;
  Constant *c_00;
  Instruction *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  if (c == (Constant *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xe3,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateIntegerConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  iVar1 = (*c->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*c->type_->_vptr_Type[10])();
    iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0x24);
    if ((iVar1 != 0x20) && (iVar1 != 0x40)) {
      __assert_fail("width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0xe6,
                    "uint32_t spvtools::opt::(anonymous namespace)::NegateIntegerConstant(analysis::ConstantManager *, const analysis::Constant *)"
                   );
    }
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (iVar1 == 0x40) {
      uVar3 = analysis::Constant::GetU64(c);
      ExtractInts((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,-uVar3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_30);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
    }
    else {
      uVar2 = analysis::Constant::GetU32(c);
      local_30._M_impl.super__Vector_impl_data._M_start._0_4_ = -uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,(uint *)&local_30)
      ;
    }
    c_00 = analysis::ConstantManager::GetConstant
                     (const_mgr,c->type_,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c_00,0,(inst_iterator *)0x0);
    uVar2 = Instruction::result_id(this);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    return uVar2;
  }
  __assert_fail("c->type()->AsInteger()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xe4,
                "uint32_t spvtools::opt::(anonymous namespace)::NegateIntegerConstant(analysis::ConstantManager *, const analysis::Constant *)"
               );
}

Assistant:

uint32_t NegateIntegerConstant(analysis::ConstantManager* const_mgr,
                               const analysis::Constant* c) {
  assert(c);
  assert(c->type()->AsInteger());
  uint32_t width = c->type()->AsInteger()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
  if (width == 64) {
    uint64_t uval = static_cast<uint64_t>(0 - c->GetU64());
    words = ExtractInts(uval);
  } else {
    words.push_back(static_cast<uint32_t>(0 - c->GetU32()));
  }

  const analysis::Constant* negated_const =
      const_mgr->GetConstant(c->type(), std::move(words));
  return const_mgr->GetDefiningInstruction(negated_const)->result_id();
}